

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

int vrf_line(order_t *o,int mode)

{
  lineorder_t *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  
  lVar3 = 0;
  lVar2 = o->lines;
  if (o->lines < 1) {
    lVar2 = lVar3;
  }
  for (; lVar3 != lVar2; lVar3 = lVar3 + 1) {
    plVar1 = o->lineorders + lVar3;
    lVar4 = (long)plVar1->linenumber + tdefs[5].vtotal + plVar1->okey + plVar1->custkey +
            plVar1->partkey + plVar1->suppkey;
    for (pcVar5 = plVar1->orderdate; (long)*pcVar5 != 0; pcVar5 = pcVar5 + 1) {
      lVar4 = lVar4 + *pcVar5;
    }
    for (pcVar5 = o->lineorders[lVar3].opriority; (long)*pcVar5 != 0; pcVar5 = pcVar5 + 1) {
      lVar4 = lVar4 + *pcVar5;
    }
    tdefs[5].vtotal =
         o->lineorders[lVar3].tax + o->lineorders[lVar3].order_totalprice +
         o->lineorders[lVar3].revenue + o->lineorders[lVar3].quantity +
         o->lineorders[lVar3].supp_cost + o->lineorders[lVar3].extended_price +
         o->lineorders[lVar3].discount + o->lineorders[lVar3].ship_priority + lVar4;
    for (pcVar5 = o->lineorders[lVar3].commit_date; (long)*pcVar5 != 0; pcVar5 = pcVar5 + 1) {
      tdefs[5].vtotal = tdefs[5].vtotal + (long)*pcVar5;
    }
    for (pcVar5 = o->lineorders[lVar3].shipmode; (long)*pcVar5 != 0; pcVar5 = pcVar5 + 1) {
      tdefs[5].vtotal = tdefs[5].vtotal + (long)*pcVar5;
    }
  }
  return 0;
}

Assistant:

int
vrf_line(order_t *o, int mode)
{
    int i;

    UNUSED(mode);
    for (i = 0; i < o->lines; i++)
        {
	    VRF_STRT(LINE);
	    VRF_HUGE(LINE, o->lineorders[i].okey);
	    VRF_INT(LINE, o->lineorders[i].linenumber);
	    VRF_INT(LINE, o->lineorders[i].custkey);
	    VRF_INT(LINE, o->lineorders[i].partkey);
	    VRF_INT(LINE, o->lineorders[i].suppkey);
	    VRF_STR(LINE, o->lineorders[i].orderdate);
	    VRF_STR(LINE, o->lineorders[i].opriority);
	    VRF_INT(LINE, o->lineorders[i].ship_priority);
	    VRF_INT(LINE, o->lineorders[i].quantity);
	    VRF_INT(LINE, o->lineorders[i].extended_price);
	    VRF_INT(LINE, o->lineorders[i].order_totalprice);
	    VRF_INT(LINE, o->lineorders[i].discount);
	    VRF_INT(LINE, o->lineorders[i].revenue);
	    VRF_INT(LINE, o->lineorders[i].supp_cost);
	    VRF_INT(LINE, o->lineorders[i].tax);
	    VRF_STR(LINE, o->lineorders[i].commit_date);
	    VRF_STR(LINE, o->lineorders[i].shipmode);
	    VRF_END(LINE);
        }

    return(0);
}